

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

bool handle_command_args(int argc,char **argv,Arguments *args)

{
  pointer *ppbVar1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  size_type *psVar5;
  void *pvVar6;
  Arguments *pAVar7;
  ulong uVar8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_7b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  undefined1 local_768 [16];
  Arguments *local_758;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fileArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> typeArg
  ;
  ValueArg<unsigned_long> limitArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  codepageArg;
  SwitchArg verboseArg;
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  allowedVals;
  CmdLine cmd;
  ValueArg<char> separatorArg;
  
  psVar2 = &typeArg.super_Arg._flag._M_string_length;
  typeArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&typeArg,"Convert a TSV or CSV file to a \'clean\' UTF-8 encoded TSV output",
             "");
  psVar3 = &codepageArg.super_Arg._flag._M_string_length;
  codepageArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&codepageArg,"0.1","");
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&typeArg,' ',(string *)&codepageArg,true);
  if (codepageArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(codepageArg.super_Arg._vptr_Arg);
  }
  if (typeArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(typeArg.super_Arg._vptr_Arg);
  }
  typeArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&typeArg,"csv","");
  typeArg.super_Arg._flag.field_2._8_8_ = &typeArg.super_Arg._name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&typeArg.super_Arg._flag.field_2 + 8),"tsv","");
  __l._M_len = 2;
  __l._M_array = (iterator)&typeArg;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&allowed,__l,(allocator_type *)&codepageArg);
  lVar9 = 0;
  do {
    pvVar6 = *(void **)((long)&typeArg.super_Arg._flag.field_2 + lVar9 + 8);
    if ((void *)((long)&typeArg.super_Arg._name._M_string_length + lVar9) != pvVar6) {
      operator_delete(pvVar6);
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValuesConstraint(&allowedVals,&allowed);
  codepageArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&codepageArg,"t","");
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &fileArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  local_758 = args;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fileArg,"type","");
  psVar2 = &limitArg.super_Arg._flag._M_string_length;
  limitArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&limitArg,"The type of input file","");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"csv","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&typeArg,(string *)&codepageArg,(string *)&fileArg,(string *)&limitArg,false,&local_6f8
             ,&allowedVals.
               super_Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  psVar4 = &fileArg.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  if (limitArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(limitArg.super_Arg._vptr_Arg);
  }
  if (fileArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (codepageArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(codepageArg.super_Arg._vptr_Arg);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&typeArg);
  codepageArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&codepageArg,"s","");
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fileArg,"separator","");
  limitArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&limitArg,"Separator character to use when decoding","");
  psVar5 = &verboseArg.super_Arg._flag._M_string_length;
  verboseArg.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&verboseArg,"separator character","");
  TCLAP::ValueArg<char>::ValueArg
            (&separatorArg,(string *)&codepageArg,(string *)&fileArg,(string *)&limitArg,false,',',
             (string *)&verboseArg,(Visitor *)0x0);
  if (verboseArg.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(verboseArg.super_Arg._vptr_Arg);
  }
  if (limitArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(limitArg.super_Arg._vptr_Arg);
  }
  if (fileArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (codepageArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(codepageArg.super_Arg._vptr_Arg);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&separatorArg);
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fileArg,"c","");
  limitArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&limitArg,"codepage","");
  verboseArg.super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&verboseArg,
             "The codepage to decode the input file if automatic detection doesn\'t work","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"codepage","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&codepageArg,(string *)&fileArg,(string *)&limitArg,(string *)&verboseArg,false,
             &local_718,&local_7b8,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  psVar3 = &fileArg.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  if (verboseArg.super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(verboseArg.super_Arg._vptr_Arg);
  }
  if (limitArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(limitArg.super_Arg._vptr_Arg);
  }
  if (fileArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&codepageArg);
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fileArg,"v","");
  limitArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&limitArg,"verbose","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,"Display a progress bar during parsing","");
  TCLAP::Arg::Arg(&verboseArg.super_Arg,(string *)&fileArg,(string *)&limitArg,&local_7b8,false,
                  false,(Visitor *)0x0);
  verboseArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d530;
  verboseArg.super_Arg._163_2_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  if (limitArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(limitArg.super_Arg._vptr_Arg);
  }
  if (fileArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&verboseArg);
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fileArg,"l","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"limit","");
  ppbVar1 = &args_1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&args_1,"limit to the first <limit> records","");
  local_778._M_allocated_capacity = (size_type)local_768;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"limit","");
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&limitArg,(string *)&fileArg,&local_7b8,(string *)&args_1,false,0,(string *)&local_778,
             (Visitor *)0x0);
  if ((undefined1 *)local_778._M_allocated_capacity != local_768) {
    operator_delete((void *)local_778._M_allocated_capacity);
  }
  if (args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(args_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  if (fileArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&limitArg);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"file","");
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&args_1,"input file","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"filenameString","");
  local_778._M_allocated_capacity = (size_type)local_768;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"value","");
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&fileArg,&local_7b8,(string *)&args_1,true,&local_738,(string *)&local_778,
                      false,(Visitor *)0x0);
  if ((undefined1 *)local_778._M_allocated_capacity != local_768) {
    operator_delete((void *)local_778._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p);
  }
  if (args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(args_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&fileArg);
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < argc) {
    uVar8 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_7b8,argv[uVar8],(allocator *)local_778._M_local_buf);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                 &local_7b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
        operator_delete(local_7b8._M_dataplus._M_p);
      }
      uVar8 = uVar8 + 1;
    } while ((uint)argc != uVar8);
  }
  TCLAP::CmdLine::parse(&cmd,&args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args_1);
  pAVar7 = local_758;
  std::__cxx11::string::_M_assign((string *)local_758);
  pAVar7->verbose = (bool)verboseArg.super_Arg._163_1_;
  std::__cxx11::string::_M_assign((string *)&pAVar7->inputFile);
  pAVar7->limit = limitArg._value;
  std::__cxx11::string::_M_assign((string *)&pAVar7->codepage);
  pAVar7->separator = separatorArg.super_Arg._163_1_;
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0011d7c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._typeDesc._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._typeDesc.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._default._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._default.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._value._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._value.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._value._M_dataplus._M_p);
  }
  fileArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._requireLabel._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._requireLabel.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._description._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._description.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._name._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._name.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._flag._M_dataplus._M_p !=
      &fileArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag.field_2) {
    operator_delete(fileArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._flag._M_dataplus._M_p);
  }
  limitArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0011d898;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)limitArg._typeDesc._M_dataplus._M_p != &limitArg._typeDesc.field_2) {
    operator_delete(limitArg._typeDesc._M_dataplus._M_p);
  }
  limitArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)limitArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &limitArg.super_Arg._requireLabel.field_2) {
    operator_delete(limitArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)limitArg.super_Arg._description._M_dataplus._M_p !=
      &limitArg.super_Arg._description.field_2) {
    operator_delete(limitArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)limitArg.super_Arg._name._M_dataplus._M_p != &limitArg.super_Arg._name.field_2) {
    operator_delete(limitArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)limitArg.super_Arg._flag._M_dataplus._M_p != &limitArg.super_Arg._flag.field_2) {
    operator_delete(limitArg.super_Arg._flag._M_dataplus._M_p);
  }
  verboseArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)verboseArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &verboseArg.super_Arg._requireLabel.field_2) {
    operator_delete(verboseArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)verboseArg.super_Arg._description._M_dataplus._M_p !=
      &verboseArg.super_Arg._description.field_2) {
    operator_delete(verboseArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)verboseArg.super_Arg._name._M_dataplus._M_p != &verboseArg.super_Arg._name.field_2) {
    operator_delete(verboseArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)verboseArg.super_Arg._flag._M_dataplus._M_p != &verboseArg.super_Arg._flag.field_2) {
    operator_delete(verboseArg.super_Arg._flag._M_dataplus._M_p);
  }
  codepageArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0011d7c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg._typeDesc._M_dataplus._M_p != &codepageArg._typeDesc.field_2) {
    operator_delete(codepageArg._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg._default._M_dataplus._M_p != &codepageArg._default.field_2) {
    operator_delete(codepageArg._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg._value._M_dataplus._M_p != &codepageArg._value.field_2) {
    operator_delete(codepageArg._value._M_dataplus._M_p);
  }
  codepageArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &codepageArg.super_Arg._requireLabel.field_2) {
    operator_delete(codepageArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg.super_Arg._description._M_dataplus._M_p !=
      &codepageArg.super_Arg._description.field_2) {
    operator_delete(codepageArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg.super_Arg._name._M_dataplus._M_p != &codepageArg.super_Arg._name.field_2) {
    operator_delete(codepageArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)codepageArg.super_Arg._flag._M_dataplus._M_p != &codepageArg.super_Arg._flag.field_2) {
    operator_delete(codepageArg.super_Arg._flag._M_dataplus._M_p);
  }
  separatorArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0011d960;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)separatorArg._typeDesc._M_dataplus._M_p != &separatorArg._typeDesc.field_2) {
    operator_delete(separatorArg._typeDesc._M_dataplus._M_p);
  }
  separatorArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)separatorArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &separatorArg.super_Arg._requireLabel.field_2) {
    operator_delete(separatorArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)separatorArg.super_Arg._description._M_dataplus._M_p !=
      &separatorArg.super_Arg._description.field_2) {
    operator_delete(separatorArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)separatorArg.super_Arg._name._M_dataplus._M_p != &separatorArg.super_Arg._name.field_2) {
    operator_delete(separatorArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)separatorArg.super_Arg._flag._M_dataplus._M_p != &separatorArg.super_Arg._flag.field_2) {
    operator_delete(separatorArg.super_Arg._flag._M_dataplus._M_p);
  }
  typeArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0011d7c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg._typeDesc._M_dataplus._M_p != &typeArg._typeDesc.field_2) {
    operator_delete(typeArg._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg._default._M_dataplus._M_p != &typeArg._default.field_2) {
    operator_delete(typeArg._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg._value._M_dataplus._M_p != &typeArg._value.field_2) {
    operator_delete(typeArg._value._M_dataplus._M_p);
  }
  typeArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0011d3d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &typeArg.super_Arg._requireLabel.field_2) {
    operator_delete(typeArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg.super_Arg._description._M_dataplus._M_p != &typeArg.super_Arg._description.field_2)
  {
    operator_delete(typeArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg.super_Arg._name._M_dataplus._M_p != &typeArg.super_Arg._name.field_2) {
    operator_delete(typeArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typeArg.super_Arg._flag._M_dataplus._M_p != &typeArg.super_Arg._flag.field_2) {
    operator_delete(typeArg.super_Arg._flag._M_dataplus._M_p);
  }
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValuesConstraint(&allowedVals);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allowed);
  TCLAP::CmdLine::~CmdLine(&cmd);
  return true;
}

Assistant:

bool handle_command_args(int argc, const char * const * argv, Arguments& args) {
	try {
		TCLAP::CmdLine cmd("Convert a TSV or CSV file to a 'clean' UTF-8 encoded TSV output", ' ', "0.1");
		
		std::vector<std::string> allowed { "csv", "tsv" };
		TCLAP::ValuesConstraint<std::string> allowedVals( allowed );
		TCLAP::ValueArg<std::string> typeArg("t", "type", "The type of input file", false, "csv", &allowedVals);
		cmd.add( typeArg );

		TCLAP::ValueArg<char> separatorArg("s", "separator", "Separator character to use when decoding", false, ',', "separator character");
		cmd.add( separatorArg );

		TCLAP::ValueArg<std::string> codepageArg("c", "codepage", "The codepage to decode the input file if automatic detection doesn't work", false, "", "codepage");
		cmd.add( codepageArg );

		TCLAP::SwitchArg verboseArg("v", "verbose", "Display a progress bar during parsing");
		cmd.add( verboseArg );
		TCLAP::ValueArg<size_t> limitArg("l", "limit", "limit to the first <limit> records", false, 0, "limit");
		cmd.add( limitArg );
		TCLAP::UnlabeledValueArg<std::string> fileArg("file", "input file", true, "filenameString", "value");
		cmd.add( fileArg );
		
		// Parse the argv array.
		cmd.parse( argc, argv );
		
		args.type = typeArg.getValue();
		args.verbose = verboseArg.getValue();
		args.inputFile = fileArg.getValue();
		args.limit = limitArg.getValue();
		args.codepage = codepageArg.getValue();
		args.separator = separatorArg.getValue();
	}
	catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return false;
	}
	return true;
}